

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::CopyFileIfDifferent(string *source,string *destination)

{
  bool bVar1;
  bool bVar2;
  string new_destination;
  string local_60;
  string source_name;
  
  bVar1 = FileIsDirectory(destination);
  if (bVar1) {
    std::__cxx11::string::string((string *)&new_destination,(string *)destination);
    ConvertToUnixSlashes(&new_destination);
    std::__cxx11::string::push_back((char)&new_destination);
    std::__cxx11::string::string((string *)&source_name,(string *)source);
    GetFilenameName(&local_60,&source_name);
    std::__cxx11::string::append((string *)&new_destination);
    std::__cxx11::string::~string((string *)&local_60);
    bVar2 = FilesDiffer(source,&new_destination);
    bVar1 = true;
    if (bVar2) {
      bVar1 = CopyFileAlways(source,destination);
    }
    std::__cxx11::string::~string((string *)&source_name);
    std::__cxx11::string::~string((string *)&new_destination);
  }
  else {
    bVar2 = FilesDiffer(source,destination);
    bVar1 = true;
    if (bVar2) {
      bVar1 = CopyFileAlways(source,destination);
      return bVar1;
    }
  }
  return bVar1;
}

Assistant:

bool SystemTools::CopyFileIfDifferent(const std::string& source,
                                      const std::string& destination)
{
  // special check for a destination that is a directory
  // FilesDiffer does not handle file to directory compare
  if(SystemTools::FileIsDirectory(destination))
    {
    std::string new_destination = destination;
    SystemTools::ConvertToUnixSlashes(new_destination);
    new_destination += '/';
    std::string source_name = source;
    new_destination += SystemTools::GetFilenameName(source_name);
    if(SystemTools::FilesDiffer(source, new_destination))
      {
      return SystemTools::CopyFileAlways(source, destination);
      }
    else
      {
      // the files are the same so the copy is done return
      // true
      return true;
      }
    }
  // source and destination are files so do a copy if they
  // are different
  if(SystemTools::FilesDiffer(source, destination))
    {
    return SystemTools::CopyFileAlways(source, destination);
    }
  // at this point the files must be the same so return true
  return true;
}